

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::GatherBase::VerifyCompute(GatherBase *this)

{
  Vec4 *pVVar1;
  float *pfVar2;
  float fVar3;
  float *pfVar4;
  float fVar5;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  double local_60;
  double local_58;
  double local_50;
  undefined1 local_48 [12];
  float local_3c;
  undefined1 local_38 [8];
  float local_30;
  undefined1 local_28 [4];
  float local_24;
  
  pfVar4 = (float *)glu::CallLogWrapper::glMapBufferRange
                              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.
                                super_CallLogWrapper,0x90d2,0,0x10,1);
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])(&local_70,this);
  fVar5 = *pfVar4 - local_70;
  fVar3 = -fVar5;
  if (-fVar5 <= fVar5) {
    fVar3 = fVar5;
  }
  pVVar1 = &(this->super_TGBase).g_color_eps;
  if (fVar3 < pVVar1->m_data[0] || fVar3 == pVVar1->m_data[0]) {
    local_6c = pfVar4[1] - local_6c;
    fVar3 = -local_6c;
    if (-local_6c <= local_6c) {
      fVar3 = local_6c;
    }
    pfVar2 = (this->super_TGBase).g_color_eps.m_data + 1;
    if (fVar3 < *pfVar2 || fVar3 == *pfVar2) {
      local_68 = pfVar4[2] - local_68;
      fVar3 = -local_68;
      if (-local_68 <= local_68) {
        fVar3 = local_68;
      }
      pfVar2 = (this->super_TGBase).g_color_eps.m_data + 2;
      if (fVar3 < *pfVar2 || fVar3 == *pfVar2) {
        local_64 = pfVar4[3] - local_64;
        fVar3 = -local_64;
        if (-local_64 <= local_64) {
          fVar3 = local_64;
        }
        pfVar2 = (this->super_TGBase).g_color_eps.m_data + 3;
        if (fVar3 < *pfVar2 || fVar3 == *pfVar2) {
          return 0;
        }
      }
    }
  }
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])(&local_70,this);
  local_50 = (double)local_70;
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])(local_28,this);
  local_58 = (double)local_24;
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])(local_38,this);
  local_60 = (double)local_30;
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])(local_48,this);
  anon_unknown_0::Output
            ("Expected %f, %f, %f, %f, got: %f, %f, %f, %f, epsilon: %f, %f, %f, %f",local_50,
             local_58,local_60,(double)local_3c,(double)*pfVar4,(double)pfVar4[1],(double)pfVar4[2],
             (double)pfVar4[3]);
  return -1;
}

Assistant:

virtual long VerifyCompute()
	{
		Vec4* data;
		data = static_cast<Vec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(Vec4), GL_MAP_READ_BIT));
		if (!ColorEqual(data[0], Expected(), g_color_eps))
		{ // for unorms
			Output("Expected %f, %f, %f, %f, got: %f, %f, %f, %f, epsilon: %f, %f, %f, %f", Expected().x(),
				   Expected().y(), Expected().z(), Expected().w(), data[0].x(), data[0].y(), data[0].z(), data[0].w());
			return ERROR;
		}
		return NO_ERROR;
	}